

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O3

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CallExpression *call_expression)

{
  char cVar1;
  
  PrintTabs(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->stream_,"CallExpression: ",0x10);
  cVar1 = (char)&this->stream_;
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->stream_ + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  this->num_tabs_ = this->num_tabs_ + 1;
  (*(call_expression->function_name_->super_BaseElement)._vptr_BaseElement[2])
            (call_expression->function_name_,this);
  (*(call_expression->args_->super_BaseElement)._vptr_BaseElement[2])(call_expression->args_,this);
  this->num_tabs_ = this->num_tabs_ + -1;
  return;
}

Assistant:

void PrintVisitor::Visit(CallExpression* call_expression) {
  PrintTabs();
  stream_ << "CallExpression: " << std::endl;

  ++num_tabs_;
  call_expression->function_name_->Accept(this);
  call_expression->args_->Accept(this);
  --num_tabs_;
}